

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

DataAddress * __thiscall
Rml::DataModel::ResolveAddress
          (DataAddress *__return_storage_ptr__,DataModel *this,String *address_str,Element *element)

{
  bool bVar1;
  DataModel *pDVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  const_reference pvVar6;
  reference this_00;
  const_iterator __last;
  undefined8 uVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  __normal_iterator<const_Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
  local_f0;
  __normal_iterator<const_Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
  local_e8;
  __normal_iterator<Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
  local_e0;
  __normal_iterator<Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
  local_d8;
  const_iterator local_d0;
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *local_c8;
  DataAddress *replace_address;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>
  local_b8;
  const_iterator it_alias_name;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>
  *alias_names;
  uint8_t *local_a0;
  undefined1 local_98 [8];
  const_iterator it_element;
  Element *ancestor;
  uint8_t *local_78;
  NodePtr local_60;
  const_iterator it;
  String *first_name;
  undefined1 local_40 [8];
  DataAddress address;
  Element *element_local;
  String *address_str_local;
  DataModel *this_local;
  
  address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)element;
  ParseAddress((DataAddress *)local_40,address_str);
  bVar1 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::empty
                    ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                     local_40);
  if (bVar1) {
    ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
              (__return_storage_ptr__,
               (vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_40);
  }
  else {
    it.mInfo = (uint8_t *)
               ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::front
                         ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                          local_40);
    cVar8 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->variables,(key_type *)it.mInfo);
    it.mKeyVals = (NodePtr)cVar8.mInfo;
    local_60 = cVar8.mKeyVals;
    cVar8 = robin_hood::detail::
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->variables);
    local_78 = cVar8.mInfo;
    ancestor = (Element *)cVar8.mKeyVals;
    bVar1 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::Iter<true>::operator!=((Iter<true> *)&local_60,(Iter<true> *)&ancestor);
    if (!bVar1) {
      it_element.mInfo =
           (uint8_t *)
           address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        bVar1 = false;
        if (it_element.mInfo != (uint8_t *)0x0) {
          pDVar2 = Element::GetDataModel((Element *)it_element.mInfo);
          bVar1 = pDVar2 == this;
        }
        if (!bVar1) {
          uVar7 = ::std::__cxx11::string::c_str();
          Log::Message(LT_WARNING,"Could not find variable name \'%s\' in data model.",uVar7);
          memset(__return_storage_ptr__,0,0x18);
          ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                    (__return_storage_ptr__);
          goto LAB_004fa4b2;
        }
        cVar9 = robin_hood::detail::
                Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
                ::find(&this->aliases,(key_type *)&it_element.mInfo);
        it_element.mKeyVals = (NodePtr)cVar9.mInfo;
        local_98 = (undefined1  [8])cVar9.mKeyVals;
        cVar9 = robin_hood::detail::
                Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
                ::end(&this->aliases);
        local_a0 = cVar9.mInfo;
        alias_names = (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>
                       *)cVar9.mKeyVals;
        bVar1 = robin_hood::detail::
                Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
                ::Iter<true>::operator!=((Iter<true> *)local_98,(Iter<true> *)&alias_names);
        if (bVar1) {
          ppVar3 = robin_hood::detail::
                   Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
                   ::Iter<true>::operator->((Iter<true> *)local_98);
          it_alias_name._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
                *)&ppVar3->second;
          local_b8._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
                *)itlib::
                  flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>
                  ::find<std::__cxx11::string>
                            ((flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>
                              *)it_alias_name._M_current,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             it.mInfo);
          replace_address =
               (DataAddress *)
               itlib::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>
               ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>
                      *)it_alias_name._M_current);
          bVar1 = __gnu_cxx::operator!=
                            (&local_b8,
                             (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>
                              *)&replace_address);
          if (bVar1) goto LAB_004fa2c2;
        }
        it_element.mInfo = (uint8_t *)Element::GetParentNode((Element *)it_element.mInfo);
      } while( true );
    }
    ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
              (__return_storage_ptr__,
               (vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_40);
  }
LAB_004fa4b2:
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
            ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_40);
  return __return_storage_ptr__;
LAB_004fa2c2:
  ppVar4 = __gnu_cxx::
           __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>
           ::operator->(&local_b8);
  local_c8 = &ppVar4->second;
  bVar1 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::empty
                    (local_c8);
  if (!bVar1) {
    ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::front(local_c8);
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pvVar6 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::
               operator[](local_c8,0);
      this_00 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::
                operator[]((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                           local_40,0);
      DataAddressEntry::operator=(this_00,pvVar6);
      local_e0._M_current =
           (DataAddressEntry *)
           ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::begin
                     ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                      local_40);
      local_d8 = __gnu_cxx::
                 __normal_iterator<Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
                 ::operator+(&local_e0,1);
      __gnu_cxx::
      __normal_iterator<Rml::DataAddressEntry_const*,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>
      ::__normal_iterator<Rml::DataAddressEntry*>
                ((__normal_iterator<Rml::DataAddressEntry_const*,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>
                  *)&local_d0,&local_d8);
      local_f0._M_current =
           (DataAddressEntry *)
           ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::begin
                     (local_c8);
      local_e8 = __gnu_cxx::
                 __normal_iterator<const_Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
                 ::operator+(&local_f0,1);
      __last = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::end
                         (local_c8);
      ::std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>::
      insert<__gnu_cxx::__normal_iterator<Rml::DataAddressEntry_const*,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,void>
                ((vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>> *)local_40,
                 local_d0,local_e8,
                 (__normal_iterator<const_Rml::DataAddressEntry_*,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>
                  )__last._M_current);
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                (__return_storage_ptr__,
                 (vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_40);
      goto LAB_004fa4b2;
    }
  }
  memset(__return_storage_ptr__,0,0x18);
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
            (__return_storage_ptr__);
  goto LAB_004fa4b2;
}

Assistant:

DataAddress DataModel::ResolveAddress(const String& address_str, Element* element) const
{
	DataAddress address = ParseAddress(address_str);

	if (address.empty())
		return address;

	const String& first_name = address.front().name;

	auto it = variables.find(first_name);
	if (it != variables.end())
		return address;

	// Look for a variable alias for the first name.

	Element* ancestor = element;
	while (ancestor && ancestor->GetDataModel() == this)
	{
		auto it_element = aliases.find(ancestor);
		if (it_element != aliases.end())
		{
			const auto& alias_names = it_element->second;
			auto it_alias_name = alias_names.find(first_name);
			if (it_alias_name != alias_names.end())
			{
				const DataAddress& replace_address = it_alias_name->second;
				if (replace_address.empty() || replace_address.front().name.empty())
				{
					// Variable alias is invalid
					return DataAddress();
				}

				// Insert the full alias address, replacing the first element.
				address[0] = replace_address[0];
				address.insert(address.begin() + 1, replace_address.begin() + 1, replace_address.end());
				return address;
			}
		}

		ancestor = ancestor->GetParentNode();
	}

	Log::Message(Log::LT_WARNING, "Could not find variable name '%s' in data model.", address_str.c_str());

	return DataAddress();
}